

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::set
          (EntryImpl *this,Own<const_kj::Directory> *value)

{
  Disposer *pDVar1;
  Directory *pDVar2;
  
  pDVar1 = value->disposer;
  pDVar2 = value->ptr;
  value->ptr = (Directory *)0x0;
  if ((this->node).tag != 0) {
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&this->node);
  }
  (this->node).field_1.forceAligned = pDVar1;
  *(Directory **)((long)&(this->node).field_1 + 8) = pDVar2;
  (this->node).tag = 2;
  return;
}

Assistant:

void set(Own<const Directory>&& value) {
      node.init<DirectoryNode>(DirectoryNode { kj::mv(value) });
    }